

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O3

float __thiscall
QuasispeciesEdgeCalculator::overlapSize
          (QuasispeciesEdgeCalculator *this,int e1,int e2,int s1,int s2)

{
  int iVar1;
  
  if (e1 != e2 || s1 != s2) {
    if (s1 == s2) {
      if (e2 <= e1) {
LAB_001553de:
        iVar1 = -s1;
LAB_001553e0:
        iVar1 = e2 + iVar1;
        goto LAB_001553f9;
      }
    }
    else if (e1 == e2) {
      if (s1 <= s2) {
LAB_001553f6:
        iVar1 = e1 - s2;
        goto LAB_001553f9;
      }
    }
    else {
      if (e2 <= e1) {
        if (s2 < s1) goto LAB_001553de;
        iVar1 = -s2;
        goto LAB_001553e0;
      }
      if (s1 < s2) goto LAB_001553f6;
    }
  }
  iVar1 = e1 - s1;
LAB_001553f9:
  return (float)iVar1;
}

Assistant:

float QuasispeciesEdgeCalculator::overlapSize(int e1, int e2, int s1, int s2) const {
    if (s1 == s2 && e1 == e2) {
        // -----
        // -----
        return e1 - s1;
    } else if (s1 == s2) {
        // ----  AND -----
        // ----- AND ----
        if (e1 < e2) {
            return e1 - s1;
        } else {
            return e2 - s2;
        }
    } else if (e1 == e2) {
        //  ---- AND -----
        // ----- AND  ----
        if (s1 > s2) {
            return e1 - s1;
        } else {
            return e2 - s2;
        }
    } else if (e1 < e2) {
        // ----    AND   --
        //   ----  AND ------
        if (s1 < s2) {
            // ----
            //   ----
            return e1 - s2;
        } else {
            //   --
            // ------
            return e1 - s1;
        }
    } else {
        //   ---- AND ------
        // ----   AND   --
        if (s2 < s1) {
            //   ----
            // ----
            return e2 - s1;
        } else {
            // ------
            //   --
            return e2 - s2;
        }
    }
}